

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O1

bool __thiscall cmCTestP4::UserParser::ProcessLine(UserParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  cmCTestP4 *pcVar3;
  bool bVar4;
  mapped_type *pmVar5;
  User NewUser;
  key_type local_d0;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  bVar4 = cmsys::RegularExpression::find
                    (&this->RegexUser,(this->super_LineParser).Line._M_dataplus._M_p,
                     &(this->RegexUser).regmatch);
  if (bVar4) {
    local_a8 = 0;
    local_a0 = 0;
    local_90 = &local_80;
    local_88 = 0;
    local_80 = 0;
    local_70 = &local_60;
    local_68 = 0;
    local_60 = 0;
    local_50 = &local_40;
    local_48 = 0;
    local_40 = 0;
    pcVar2 = (this->RegexUser).regmatch.startp[1];
    paVar1 = &local_d0.field_2;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    local_b0 = &local_a0;
    if (pcVar2 == (char *)0x0) {
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,pcVar2,(this->RegexUser).regmatch.endp[1]);
    }
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    pcVar2 = (this->RegexUser).regmatch.startp[2];
    if (pcVar2 == (char *)0x0) {
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,pcVar2,(this->RegexUser).regmatch.endp[2]);
    }
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    pcVar2 = (this->RegexUser).regmatch.startp[3];
    if (pcVar2 == (char *)0x0) {
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,pcVar2,(this->RegexUser).regmatch.endp[3]);
    }
    std::__cxx11::string::operator=((string *)&local_90,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    pcVar2 = (this->RegexUser).regmatch.startp[4];
    if (pcVar2 == (char *)0x0) {
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,pcVar2,(this->RegexUser).regmatch.endp[4]);
    }
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    pcVar3 = this->P4;
    pcVar2 = (this->RegexUser).regmatch.startp[1];
    if (pcVar2 == (char *)0x0) {
      local_d0._M_string_length = 0;
      local_d0.field_2._M_local_buf[0] = '\0';
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,pcVar2,(this->RegexUser).regmatch.endp[1]);
    }
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
             ::operator[](&pcVar3->Users,&local_d0);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    std::__cxx11::string::_M_assign((string *)&pmVar5->Name);
    std::__cxx11::string::_M_assign((string *)&pmVar5->EMail);
    std::__cxx11::string::_M_assign((string *)&pmVar5->AccessTime);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,
                      CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                               local_d0.field_2._M_local_buf[0]) + 1);
    }
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
    }
  }
  return !bVar4;
}

Assistant:

bool ProcessLine() override
  {
    if (this->RegexUser.find(this->Line)) {
      User NewUser;

      NewUser.UserName = this->RegexUser.match(1);
      NewUser.EMail = this->RegexUser.match(2);
      NewUser.Name = this->RegexUser.match(3);
      NewUser.AccessTime = this->RegexUser.match(4);
      P4->Users[this->RegexUser.match(1)] = NewUser;

      return false;
    }
    return true;
  }